

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::taskNeedsSingleUseInput
          (BuildEngineImpl *this,Task *task,KeyType *key,uintptr_t inputID)

{
  BuildEngineDelegate *pBVar1;
  Twine local_40;
  uintptr_t local_28;
  uintptr_t inputID_local;
  KeyType *key_local;
  Task *task_local;
  BuildEngineImpl *this_local;
  
  local_28 = inputID;
  inputID_local = (uintptr_t)key;
  key_local = (KeyType *)task;
  task_local = (Task *)this;
  if (inputID < 0xffffffffffffff01) {
    addTaskInputRequest(this,task,key,inputID,false,true);
  }
  else {
    pBVar1 = this->delegate;
    llvm::Twine::Twine(&local_40,"attempt to use reserved input ID");
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_40);
    std::atomic<bool>::operator=(&this->buildCancelled,true);
  }
  return;
}

Assistant:

void taskNeedsSingleUseInput(Task* task, const KeyType& key, uintptr_t inputID) {
    // Validate the InputID.
    if (inputID > BuildEngine::kMaximumInputID) {
      delegate.error("attempt to use reserved input ID");
      buildCancelled = true;
      return;
    }

    addTaskInputRequest(task, key, inputID, false, true);
  }